

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O0

QHash<QByteArray,_QByteArray> parseHttpOptionHeader(QByteArrayView header)

{
  QByteArrayView text;
  QByteArrayView text_00;
  int iVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  qsizetype qVar7;
  storage_type *psVar8;
  Data *in_RDI;
  long in_FS_OFFSET;
  char c_1;
  char c;
  int end;
  int equal;
  int comma;
  int pos;
  QHash<QByteArray,_QByteArray> *result;
  anon_class_1_0_00000001 isSeparator;
  QByteArray value;
  QByteArrayView key;
  undefined7 in_stack_fffffffffffffe88;
  char in_stack_fffffffffffffe8f;
  QByteArrayView *in_stack_fffffffffffffe90;
  QByteArrayView *in_stack_fffffffffffffe98;
  QByteArrayView *in_stack_fffffffffffffea0;
  storage_type *in_stack_fffffffffffffea8;
  Data *asize;
  int local_100;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = false;
  *(undefined8 *)in_RDI = 0xaaaaaaaaaaaaaaaa;
  asize = in_RDI;
  QHash<QByteArray,_QByteArray>::QHash((QHash<QByteArray,_QByteArray> *)in_RDI);
  while( true ) {
    while( true ) {
      text.m_data = in_stack_fffffffffffffea8;
      text.m_size = (qsizetype)in_stack_fffffffffffffea0;
      uVar5 = nextNonWhitespace(text,(int)in_stack_fffffffffffffe98);
      qVar7 = QByteArrayView::size(&local_18);
      if ((int)uVar5 == qVar7) {
        bVar2 = true;
        goto LAB_003178fb;
      }
      qVar7 = QByteArrayView::indexOf
                        (in_stack_fffffffffffffe98,(char)((ulong)in_stack_fffffffffffffe90 >> 0x38),
                         CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
      uVar6 = (uint)qVar7;
      qVar7 = QByteArrayView::indexOf
                        (in_stack_fffffffffffffe98,(char)((ulong)in_stack_fffffffffffffe90 >> 0x38),
                         CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
      if ((uVar6 == uVar5) || ((uint)qVar7 == uVar5)) {
        bVar2 = true;
        goto LAB_003178fb;
      }
      if (uVar6 == 0xffffffff) {
        QByteArrayView::size(&local_18);
      }
      QByteArrayView::sliced
                (in_stack_fffffffffffffea0,(qsizetype)in_stack_fffffffffffffe98,
                 (qsizetype)in_stack_fffffffffffffe90);
      QByteArrayView::trimmed(in_stack_fffffffffffffe98);
      if ((uint)qVar7 < uVar6) break;
      QByteArrayView::toByteArray(in_stack_fffffffffffffe90);
      QByteArray::toLower((QByteArray *)
                          CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
      QByteArray::QByteArray((QByteArray *)0x3178ab);
      QHash<QByteArray,_QByteArray>::insert
                ((QHash<QByteArray,_QByteArray> *)in_stack_fffffffffffffe90,
                 (QByteArray *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                 (QByteArray *)0x3178c5);
      QByteArray::~QByteArray((QByteArray *)0x3178dc);
      QByteArray::~QByteArray((QByteArray *)0x3178e9);
      QByteArray::~QByteArray((QByteArray *)0x3178f6);
    }
    text_00.m_data = in_stack_fffffffffffffea8;
    text_00.m_size = (qsizetype)in_stack_fffffffffffffea0;
    local_100 = nextNonWhitespace(text_00,(int)in_stack_fffffffffffffe98);
    in_stack_fffffffffffffea8 = (storage_type *)(long)local_100;
    psVar8 = (storage_type *)QByteArrayView::size(&local_18);
    if (in_stack_fffffffffffffea8 == psVar8) break;
    QByteArray::QByteArray((QByteArray *)0x317601);
    QByteArrayView::size(&local_18);
    QByteArray::reserve((QByteArray *)in_stack_fffffffffffffea0,(qsizetype)asize);
    cVar3 = QByteArrayView::at(in_stack_fffffffffffffe90,
                               CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
    iVar1 = local_100;
    if (cVar3 == '\"') {
      while( true ) {
        local_100 = iVar1 + 1;
        in_stack_fffffffffffffea0 = (QByteArrayView *)(long)local_100;
        qVar7 = QByteArrayView::size(&local_18);
        if ((qVar7 <= (long)in_stack_fffffffffffffea0) ||
           (cVar3 = QByteArrayView::at(in_stack_fffffffffffffe90,
                                       CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88)
                                      ), cVar3 == '\"')) break;
        if (cVar3 == '\\') {
          local_100 = iVar1 + 2;
          in_stack_fffffffffffffe98 = (QByteArrayView *)(long)local_100;
          qVar7 = QByteArrayView::size(&local_18);
          if (qVar7 <= (long)in_stack_fffffffffffffe98) {
            bVar2 = true;
            bVar4 = true;
            goto LAB_00317854;
          }
          QByteArrayView::at(in_stack_fffffffffffffe90,
                             CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
        }
        QByteArray::operator+=((QByteArray *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8f);
        iVar1 = local_100;
      }
    }
    else {
      while( true ) {
        in_stack_fffffffffffffe90 = (QByteArrayView *)(long)local_100;
        qVar7 = QByteArrayView::size(&local_18);
        if (qVar7 <= (long)in_stack_fffffffffffffe90) break;
        QByteArrayView::at(in_stack_fffffffffffffe90,
                           CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
        bVar4 = parseHttpOptionHeader::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)in_stack_fffffffffffffe90,
                           in_stack_fffffffffffffe8f);
        if (bVar4) break;
        QByteArray::operator+=((QByteArray *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8f);
        local_100 = local_100 + 1;
      }
    }
    QByteArrayView::toByteArray(in_stack_fffffffffffffe90);
    QByteArray::toLower((QByteArray *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88))
    ;
    QHash<QByteArray,_QByteArray>::insert
              ((QHash<QByteArray,_QByteArray> *)in_stack_fffffffffffffe90,
               (QByteArray *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
               (QByteArray *)0x3177ec);
    QByteArray::~QByteArray((QByteArray *)0x317803);
    QByteArray::~QByteArray((QByteArray *)0x317810);
    qVar7 = QByteArrayView::indexOf
                      (in_stack_fffffffffffffe98,(char)((ulong)in_stack_fffffffffffffe90 >> 0x38),
                       CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
    if ((int)qVar7 == -1) {
      bVar2 = true;
      bVar4 = true;
    }
    else {
      bVar4 = false;
    }
LAB_00317854:
    QByteArray::~QByteArray((QByteArray *)0x317861);
    if (bVar4) {
LAB_003178fb:
      if (!bVar2) {
        QHash<QByteArray,_QByteArray>::~QHash
                  ((QHash<QByteArray,_QByteArray> *)in_stack_fffffffffffffe90);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return (QHash<QByteArray,_QByteArray>)in_RDI;
    }
  }
  bVar2 = true;
  goto LAB_003178fb;
}

Assistant:

static QHash<QByteArray, QByteArray> parseHttpOptionHeader(QByteArrayView header)
{
    // The HTTP header is of the form:
    // header          = #1(directives)
    // directives      = token | value-directive
    // value-directive = token "=" (token | quoted-string)
    QHash<QByteArray, QByteArray> result;

    int pos = 0;
    while (true) {
        // skip spaces
        pos = nextNonWhitespace(header, pos);
        if (pos == header.size())
            return result;      // end of parsing

        // pos points to a non-whitespace
        int comma = header.indexOf(',', pos);
        int equal = header.indexOf('=', pos);
        if (comma == pos || equal == pos)
            // huh? Broken header.
            return result;

        // The key name is delimited by either a comma, an equal sign or the end
        // of the header, whichever comes first
        int end = comma;
        if (end == -1)
            end = header.size();
        if (equal != -1 && end > equal)
            end = equal;        // equal sign comes before comma/end
        const auto key = header.sliced(pos, end - pos).trimmed();
        pos = end + 1;

        if (uint(equal) < uint(comma)) {
            // case: token "=" (token | quoted-string)
            // skip spaces
            pos = nextNonWhitespace(header, pos);
            if (pos == header.size())
                // huh? Broken header
                return result;

            QByteArray value;
            value.reserve(header.size() - pos);
            if (header.at(pos) == '"') {
                // case: quoted-string
                // quoted-string  = ( <"> *(qdtext | quoted-pair ) <"> )
                // qdtext         = <any TEXT except <">>
                // quoted-pair    = "\" CHAR
                ++pos;
                while (pos < header.size()) {
                    char c = header.at(pos);
                    if (c == '"') {
                        // end of quoted text
                        break;
                    } else if (c == '\\') {
                        ++pos;
                        if (pos >= header.size())
                            // broken header
                            return result;
                        c = header.at(pos);
                    }

                    value += c;
                    ++pos;
                }
            } else {
                const auto isSeparator = [](char c) {
                    static const char separators[] = "()<>@,;:\\\"/[]?={}";
                    return isLWS(c) || strchr(separators, c) != nullptr;
                };

                // case: token
                while (pos < header.size()) {
                    char c = header.at(pos);
                    if (isSeparator(c))
                        break;
                    value += c;
                    ++pos;
                }
            }

            result.insert(key.toByteArray().toLower(), value);

            // find the comma now:
            comma = header.indexOf(',', pos);
            if (comma == -1)
                return result;  // end of parsing
            pos = comma + 1;
        } else {
            // case: token
            // key is already set
            result.insert(key.toByteArray().toLower(), QByteArray());
        }
    }
}